

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ChainstateManager::LoadExternalBlockFile
          (ChainstateManager *this,AutoFile *file_in,FlatFilePos *dbp,
          multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
          *blocks_with_unknown_parent)

{
  BlockManager *this_00;
  CChainParams *b;
  Chainstate *this_01;
  base_blob<256U> *pbVar1;
  pointer ppCVar2;
  uint64_t uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  long lVar8;
  CBlockIndex *pCVar9;
  _Base_ptr p_Var10;
  long lVar11;
  ulong uVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_> __position;
  char cVar14;
  pointer ppCVar15;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>_>
  pVar16;
  string_view source_file;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock_00;
  shared_ptr<const_CBlock> pblock_01;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  ulong local_2a8;
  shared_ptr<CBlock> pblockrecursive;
  undefined1 local_250 [16];
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_240;
  uchar local_228 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_220 [2];
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_210;
  shared_ptr<CBlock> pblock;
  BufferedFile blkdat;
  int nLoaded;
  BlockValidationState dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  undefined1 local_138 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  deque<uint256,_std::allocator<uint256>_> queue;
  uint256 hash;
  MessageStartChars buf;
  uint256 auStack_84 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dbp != (FlatFilePos *)0x0) !=
      (blocks_with_unknown_parent !=
      (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
       *)0x0)) {
    __assert_fail("!dbp == !blocks_with_unknown_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x139f,
                  "void ChainstateManager::LoadExternalBlockFile(AutoFile &, FlatFilePos *, std::multimap<uint256, FlatFilePos> *)"
                 );
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  b = (this->m_options).chainparams;
  nLoaded = 0;
  BufferedFile::BufferedFile(&blkdat,file_in,8000000,0x3d0908);
  local_2a8 = blkdat.m_read_pos;
  this_00 = &this->m_blockman;
  do {
    do {
      bVar4 = BufferedFile::eof(&blkdat);
      if (bVar4) goto LAB_008bceb6;
      bVar4 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
      if (bVar4) {
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
        goto LAB_008bcf1f;
      }
      uVar12 = ((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                     .super__Vector_impl_data._M_start) + local_2a8;
      if (blkdat.nSrcPos < local_2a8) {
        local_2a8 = blkdat.nSrcPos;
      }
      blkdat.m_read_pos = local_2a8;
      if (uVar12 < blkdat.nSrcPos) {
        blkdat.m_read_pos =
             blkdat.nSrcPos -
             ((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
      }
      blkdat.nReadLimit = 0xffffffffffffffff;
      BufferedFile::FindByte(&blkdat,(b->pchMessageStart)._M_elems[0]);
      uVar3 = blkdat.m_read_pos;
      Unserialize<BufferedFile,_unsigned_char,_4UL>(&blkdat,&buf);
      bVar4 = std::operator==(&buf,&b->pchMessageStart);
      local_2a8 = uVar3 + 1;
    } while ((!bVar4) ||
            (uVar7 = ser_readdata32<BufferedFile>(&blkdat), uVar3 = blkdat.m_read_pos,
            0x3d08b0 < uVar7 - 0x50));
    if (dbp != (FlatFilePos *)0x0) {
      dbp->nPos = (uint)blkdat.m_read_pos;
    }
    local_2a8 = uVar7 + blkdat.m_read_pos;
    if (!CARRY8((ulong)uVar7,blkdat.m_read_pos)) {
      blkdat.nReadLimit = local_2a8;
    }
    CBlockHeader::CBlockHeader((CBlockHeader *)&buf);
    CBlockHeader::SerializationOps<BufferedFile,CBlockHeader,ActionUnserialize>
              ((CBlockHeader *)&buf,&blkdat);
    CBlockHeader::GetHash(&hash,(CBlockHeader *)&buf);
    BufferedFile::SkipTo(&blkdat,local_2a8);
    pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock38,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
               ,0x13d4,false);
    bVar4 = ::operator!=(&hash.super_base_blob<256U>,(base_blob<256U> *)b);
    if ((bVar4) &&
       (pCVar9 = ::node::BlockManager::LookupBlockIndex(this_00,auStack_84),
       pCVar9 == (CBlockIndex *)0x0)) {
      bVar4 = ::LogAcceptCategory(REINDEX,Debug);
      if (bVar4) {
        base_blob<256u>::ToString_abi_cxx11_((string *)&queue,(base_blob<256u> *)&hash);
        base_blob<256u>::ToString_abi_cxx11_((string *)&dummy,(base_blob<256u> *)auStack_84);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x5e;
        logging_function_00._M_str = "LoadExternalBlockFile";
        logging_function_00._M_len = 0x15;
        LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x13d8,REINDEX,Debug,
                   (ConstevalFormatString<3U>)0xcd2f68,(char (*) [22])"LoadExternalBlockFile",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queue,
                   (string *)&dummy);
        std::__cxx11::string::~string((string *)&dummy);
        std::__cxx11::string::~string((string *)&queue);
      }
      if (dbp != (FlatFilePos *)0x0 &&
          blocks_with_unknown_parent !=
          (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
           *)0x0) {
        std::
        _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
        ::_M_emplace_equal<uint256&,FlatFilePos&>
                  ((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                    *)blocks_with_unknown_parent,auStack_84,dbp);
      }
      cVar14 = '\x02';
    }
    else {
      pCVar9 = ::node::BlockManager::LookupBlockIndex(this_00,&hash);
      if ((pCVar9 == (CBlockIndex *)0x0) || ((pCVar9->nStatus & 8) == 0)) {
        blkdat.m_read_pos = uVar3;
        if (blkdat.nSrcPos < uVar3) {
          blkdat.m_read_pos = blkdat.nSrcPos;
        }
        if (((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start) + uVar3 < blkdat.nSrcPos) {
          blkdat.m_read_pos =
               blkdat.nSrcPos -
               ((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                     .super__Vector_impl_data._M_start);
        }
        std::make_shared<CBlock>();
        std::__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)&queue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_map_size);
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_map = (_Map_pointer)&::TX_WITH_WITNESS;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_map_size = (size_t)pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<BufferedFile>
                  ((ParamsWrapper<TransactionSerParams,_CBlock> *)&queue,&blkdat);
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_map = (_Map_pointer)0x0;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_map_size = (size_t)&queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur = (_Elt_pointer)0x0;
        local_2a8 = blkdat.m_read_pos;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_start._M_first._0_1_ = 0;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node =
             &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur = (_Elt_pointer)0x0;
        queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first._0_1_ = 0;
        std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
                  ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&dummy,
                   &pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
        bVar4 = AcceptBlock(this,(shared_ptr<const_CBlock> *)&dummy,(BlockValidationState *)&queue,
                            (CBlockIndex **)0x0,true,dbp,(bool *)0x0,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason);
        if (bVar4) {
          nLoaded = nLoaded + 1;
        }
        bVar4 = (int)queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_map == 2;
        ValidationState<BlockValidationResult>::~ValidationState
                  ((ValidationState<BlockValidationResult> *)&queue);
        cVar14 = bVar4 * '\x03';
      }
      else {
        bVar4 = ::operator!=(&hash.super_base_blob<256U>,(base_blob<256U> *)b);
        cVar14 = '\0';
        if (((bVar4) && (pCVar9->nHeight % 1000 == 0)) &&
           (bVar4 = ::LogAcceptCategory(REINDEX,Debug), bVar4)) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&queue,(base_blob<256u> *)&hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x5e;
          logging_function._M_str = "LoadExternalBlockFile";
          logging_function._M_len = 0x15;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function,source_file,0x13f0,REINDEX,Debug,
                     (ConstevalFormatString<2U>)0xcd2f98,(string *)&queue,&pCVar9->nHeight);
          std::__cxx11::string::~string((string *)&queue);
          cVar14 = '\0';
        }
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
    if (cVar14 == '\0') {
      bVar4 = ::operator==(&hash.super_base_blob<256U>,(base_blob<256U> *)b);
      if (bVar4) {
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_210,this);
        ppCVar2 = local_210._M_impl.super__Vector_impl_data._M_finish;
        ppCVar15 = local_210._M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppCVar15 == ppCVar2) {
            std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                      (&local_210);
            goto LAB_008bc71d;
          }
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_map = (_Map_pointer)0x0;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_map_size = (size_t)&queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur = (_Elt_pointer)0x0;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_start._M_first._0_1_ = 0;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur = (_Elt_pointer)0x0;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first._0_1_ = 0;
          local_228[0] = '\0';
          local_228[1] = '\0';
          local_228[2] = '\0';
          local_228[3] = '\0';
          local_228[4] = '\0';
          local_228[5] = '\0';
          local_228[6] = '\0';
          local_228[7] = '\0';
          a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_228;
          bVar4 = Chainstate::ActivateBestChain(*ppCVar15,(BlockValidationState *)&queue,pblock_00);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_220);
          ValidationState<BlockValidationResult>::~ValidationState
                    ((ValidationState<BlockValidationResult> *)&queue);
          ppCVar15 = ppCVar15 + 1;
        } while (bVar4);
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_210);
        cVar14 = '\x03';
      }
      else {
LAB_008bc71d:
        if ((((this->m_blockman).m_prune_mode == true) &&
            (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) &&
           (pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
          GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_240,this);
          ppCVar2 = local_240._M_impl.super__Vector_impl_data._M_finish;
          bVar4 = false;
          ppCVar15 = local_240._M_impl.super__Vector_impl_data._M_start;
          do {
            if (ppCVar15 == ppCVar2) break;
            this_01 = *ppCVar15;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map_size =
                 (size_t)&queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_first._0_1_ = 0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_node =
                 &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first._0_1_ = 0;
            std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
                      ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)local_250,
                       &pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
            pblock_01.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = _Var13._M_pi;
            pblock_01.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_250;
            bVar5 = Chainstate::ActivateBestChain(this_01,(BlockValidationState *)&queue,pblock_01);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
            if (!bVar5) {
              bVar6 = ::LogAcceptCategory(REINDEX,Debug);
              bVar4 = true;
              if (bVar6) {
                ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                          ((string *)&dummy,(ValidationState<BlockValidationResult> *)&queue);
                source_file_01._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file_01._M_len = 0x5e;
                logging_function_01._M_str = "LoadExternalBlockFile";
                logging_function_01._M_len = 0x15;
                LogPrintFormatInternal<std::__cxx11::string>
                          (logging_function_01,source_file_01,0x140f,REINDEX,Debug,
                           (ConstevalFormatString<1U>)0xc9b355,(string *)&dummy);
                std::__cxx11::string::~string((string *)&dummy);
              }
            }
            ValidationState<BlockValidationResult>::~ValidationState
                      ((ValidationState<BlockValidationResult> *)&queue);
            ppCVar15 = ppCVar15 + 1;
          } while (bVar5);
          std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_240);
          cVar14 = '\x03';
          if (bVar4) goto LAB_008bc607;
        }
        NotifyHeaderTip(this);
        cVar14 = '\x02';
        if (blocks_with_unknown_parent !=
            (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
             *)0x0) {
          std::_Deque_base<uint256,_std::allocator<uint256>_>::_Deque_base
                    (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>);
          std::deque<uint256,_std::allocator<uint256>_>::push_back
                    ((deque<uint256,_std::allocator<uint256>_> *)
                     &queue.super__Deque_base<uint256,_std::allocator<uint256>_>,&hash);
          while (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur !=
                 queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur) {
            criticalblock38.super_unique_lock._M_device =
                 *(mutex_type **)
                  ((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>).m_data._M_elems;
            pbVar1 = &(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>;
            criticalblock38.super_unique_lock._M_owns = (bool)(pbVar1->m_data)._M_elems[8];
            criticalblock38.super_unique_lock._9_1_ = (pbVar1->m_data)._M_elems[9];
            criticalblock38.super_unique_lock._10_1_ = (pbVar1->m_data)._M_elems[10];
            criticalblock38.super_unique_lock._11_1_ = (pbVar1->m_data)._M_elems[0xb];
            criticalblock38.super_unique_lock._12_1_ = (pbVar1->m_data)._M_elems[0xc];
            criticalblock38.super_unique_lock._13_1_ = (pbVar1->m_data)._M_elems[0xd];
            criticalblock38.super_unique_lock._14_1_ = (pbVar1->m_data)._M_elems[0xe];
            criticalblock38.super_unique_lock._15_1_ = (pbVar1->m_data)._M_elems[0xf];
            std::deque<uint256,_std::allocator<uint256>_>::pop_front(&queue);
            pVar16 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                     ::equal_range(&blocks_with_unknown_parent->_M_t,(key_type *)&criticalblock38);
            __position._M_node = pVar16.first._M_node._M_node;
            while (__position._M_node != pVar16.second._M_node._M_node) {
              std::make_shared<CBlock>();
              bVar4 = ::node::BlockManager::ReadBlockFromDisk
                                (this_00,pblockrecursive.
                                         super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr,(FlatFilePos *)(__position._M_node + 2));
              if (bVar4) {
                bVar4 = ::LogAcceptCategory(REINDEX,Debug);
                if (bVar4) {
                  CBlockHeader::GetHash
                            ((uint256 *)local_138,
                             &(pblockrecursive.
                               super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                              super_CBlockHeader);
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&dummy,(base_blob<256u> *)local_138);
                  base_blob<256u>::ToString_abi_cxx11_
                            ((string *)&criticalblock39,(base_blob<256u> *)&criticalblock38);
                  source_file_02._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ;
                  source_file_02._M_len = 0x5e;
                  logging_function_02._M_str = "LoadExternalBlockFile";
                  logging_function_02._M_len = 0x15;
                  LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                            (logging_function_02,source_file_02,0x1429,REINDEX,Debug,
                             (ConstevalFormatString<3U>)0xcd2fc9,
                             (char (*) [22])"LoadExternalBlockFile",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &dummy,(string *)&criticalblock39);
                  std::__cxx11::string::~string((string *)&criticalblock39);
                  std::__cxx11::string::~string((string *)&dummy);
                }
                UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                          (&criticalblock39,&cs_main,"cs_main",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                           ,0x142a,false);
                dummy.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
                dummy.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
                dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)&dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                 field_2;
                dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length
                     = 0;
                dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                _M_local_buf[0] = '\0';
                dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p
                     = (pointer)&dummy.super_ValidationState<BlockValidationResult>.m_debug_message.
                                 field_2;
                dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length
                     = 0;
                dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
                _M_local_buf[0] = '\0';
                std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<CBlock,void>
                          ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)local_138,
                           &pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
                bVar4 = AcceptBlock(this,(shared_ptr<const_CBlock> *)local_138,&dummy,
                                    (CBlockIndex **)0x0,true,(FlatFilePos *)(__position._M_node + 2)
                                    ,(bool *)0x0,true);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
                if (bVar4) {
                  nLoaded = nLoaded + 1;
                  CBlockHeader::GetHash
                            ((uint256 *)local_138,
                             &(pblockrecursive.
                               super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                              super_CBlockHeader);
                  std::deque<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                            (&queue,(uint256 *)local_138);
                }
                ValidationState<BlockValidationResult>::~ValidationState
                          (&dummy.super_ValidationState<BlockValidationResult>);
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)&criticalblock39);
              }
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
              std::
              _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
              ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                                  *)blocks_with_unknown_parent,(iterator)__position._M_node);
              NotifyHeaderTip(this);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              __position._M_node = p_Var10;
            }
          }
          std::_Deque_base<uint256,_std::allocator<uint256>_>::~_Deque_base
                    (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>);
          cVar14 = '\0';
        }
      }
    }
LAB_008bc607:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  } while (cVar14 != '\x03');
LAB_008bceb6:
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  lVar11 = std::chrono::_V2::steady_clock::now();
  _buf = (lVar11 - lVar8) / 1000000;
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_03._M_len = 0x5e;
  logging_function_03._M_str = "LoadExternalBlockFile";
  logging_function_03._M_len = 0x15;
  LogPrintFormatInternal<int,long>
            (logging_function_03,source_file_03,0x1448,ALL,Info,(ConstevalFormatString<2U>)0xcd3062,
             &nLoaded,(long *)&buf);
LAB_008bcf1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::LoadExternalBlockFile(
    AutoFile& file_in,
    FlatFilePos* dbp,
    std::multimap<uint256, FlatFilePos>* blocks_with_unknown_parent)
{
    // Either both should be specified (-reindex), or neither (-loadblock).
    assert(!dbp == !blocks_with_unknown_parent);

    const auto start{SteadyClock::now()};
    const CChainParams& params{GetParams()};

    int nLoaded = 0;
    try {
        BufferedFile blkdat{file_in, 2 * MAX_BLOCK_SERIALIZED_SIZE, MAX_BLOCK_SERIALIZED_SIZE + 8};
        // nRewind indicates where to resume scanning in case something goes wrong,
        // such as a block fails to deserialize.
        uint64_t nRewind = blkdat.GetPos();
        while (!blkdat.eof()) {
            if (m_interrupt) return;

            blkdat.SetPos(nRewind);
            nRewind++; // start one byte further next time, in case of failure
            blkdat.SetLimit(); // remove former limit
            unsigned int nSize = 0;
            try {
                // locate a header
                MessageStartChars buf;
                blkdat.FindByte(std::byte(params.MessageStart()[0]));
                nRewind = blkdat.GetPos() + 1;
                blkdat >> buf;
                if (buf != params.MessageStart()) {
                    continue;
                }
                // read size
                blkdat >> nSize;
                if (nSize < 80 || nSize > MAX_BLOCK_SERIALIZED_SIZE)
                    continue;
            } catch (const std::exception&) {
                // no valid block header found; don't complain
                // (this happens at the end of every blk.dat file)
                break;
            }
            try {
                // read block header
                const uint64_t nBlockPos{blkdat.GetPos()};
                if (dbp)
                    dbp->nPos = nBlockPos;
                blkdat.SetLimit(nBlockPos + nSize);
                CBlockHeader header;
                blkdat >> header;
                const uint256 hash{header.GetHash()};
                // Skip the rest of this block (this may read from disk into memory); position to the marker before the
                // next block, but it's still possible to rewind to the start of the current block (without a disk read).
                nRewind = nBlockPos + nSize;
                blkdat.SkipTo(nRewind);

                std::shared_ptr<CBlock> pblock{}; // needs to remain available after the cs_main lock is released to avoid duplicate reads from disk

                {
                    LOCK(cs_main);
                    // detect out of order blocks, and store them for later
                    if (hash != params.GetConsensus().hashGenesisBlock && !m_blockman.LookupBlockIndex(header.hashPrevBlock)) {
                        LogDebug(BCLog::REINDEX, "%s: Out of order block %s, parent %s not known\n", __func__, hash.ToString(),
                                 header.hashPrevBlock.ToString());
                        if (dbp && blocks_with_unknown_parent) {
                            blocks_with_unknown_parent->emplace(header.hashPrevBlock, *dbp);
                        }
                        continue;
                    }

                    // process in case the block isn't known yet
                    const CBlockIndex* pindex = m_blockman.LookupBlockIndex(hash);
                    if (!pindex || (pindex->nStatus & BLOCK_HAVE_DATA) == 0) {
                        // This block can be processed immediately; rewind to its start, read and deserialize it.
                        blkdat.SetPos(nBlockPos);
                        pblock = std::make_shared<CBlock>();
                        blkdat >> TX_WITH_WITNESS(*pblock);
                        nRewind = blkdat.GetPos();

                        BlockValidationState state;
                        if (AcceptBlock(pblock, state, nullptr, true, dbp, nullptr, true)) {
                            nLoaded++;
                        }
                        if (state.IsError()) {
                            break;
                        }
                    } else if (hash != params.GetConsensus().hashGenesisBlock && pindex->nHeight % 1000 == 0) {
                        LogDebug(BCLog::REINDEX, "Block Import: already had block %s at height %d\n", hash.ToString(), pindex->nHeight);
                    }
                }

                // Activate the genesis block so normal node progress can continue
                if (hash == params.GetConsensus().hashGenesisBlock) {
                    bool genesis_activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, nullptr)) {
                            genesis_activation_failure = true;
                            break;
                        }
                    }
                    if (genesis_activation_failure) {
                        break;
                    }
                }

                if (m_blockman.IsPruneMode() && m_blockman.m_blockfiles_indexed && pblock) {
                    // must update the tip for pruning to work while importing with -loadblock.
                    // this is a tradeoff to conserve disk space at the expense of time
                    // spent updating the tip to be able to prune.
                    // otherwise, ActivateBestChain won't be called by the import process
                    // until after all of the block files are loaded. ActivateBestChain can be
                    // called by concurrent network message processing. but, that is not
                    // reliable for the purpose of pruning while importing.
                    bool activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, pblock)) {
                            LogDebug(BCLog::REINDEX, "failed to activate chain (%s)\n", state.ToString());
                            activation_failure = true;
                            break;
                        }
                    }
                    if (activation_failure) {
                        break;
                    }
                }

                NotifyHeaderTip();

                if (!blocks_with_unknown_parent) continue;

                // Recursively process earlier encountered successors of this block
                std::deque<uint256> queue;
                queue.push_back(hash);
                while (!queue.empty()) {
                    uint256 head = queue.front();
                    queue.pop_front();
                    auto range = blocks_with_unknown_parent->equal_range(head);
                    while (range.first != range.second) {
                        std::multimap<uint256, FlatFilePos>::iterator it = range.first;
                        std::shared_ptr<CBlock> pblockrecursive = std::make_shared<CBlock>();
                        if (m_blockman.ReadBlockFromDisk(*pblockrecursive, it->second)) {
                            LogDebug(BCLog::REINDEX, "%s: Processing out of order child %s of %s\n", __func__, pblockrecursive->GetHash().ToString(),
                                    head.ToString());
                            LOCK(cs_main);
                            BlockValidationState dummy;
                            if (AcceptBlock(pblockrecursive, dummy, nullptr, true, &it->second, nullptr, true)) {
                                nLoaded++;
                                queue.push_back(pblockrecursive->GetHash());
                            }
                        }
                        range.first++;
                        blocks_with_unknown_parent->erase(it);
                        NotifyHeaderTip();
                    }
                }
            } catch (const std::exception& e) {
                // historical bugs added extra data to the block files that does not deserialize cleanly.
                // commonly this data is between readable blocks, but it does not really matter. such data is not fatal to the import process.
                // the code that reads the block files deals with invalid data by simply ignoring it.
                // it continues to search for the next {4 byte magic message start bytes + 4 byte length + block} that does deserialize cleanly
                // and passes all of the other block validation checks dealing with POW and the merkle root, etc...
                // we merely note with this informational log message when unexpected data is encountered.
                // we could also be experiencing a storage system read error, or a read of a previous bad write. these are possible, but
                // less likely scenarios. we don't have enough information to tell a difference here.
                // the reindex process is not the place to attempt to clean and/or compact the block files. if so desired, a studious node operator
                // may use knowledge of the fact that the block files are not entirely pristine in order to prepare a set of pristine, and
                // perhaps ordered, block files for later reindexing.
                LogDebug(BCLog::REINDEX, "%s: unexpected data at file offset 0x%x - %s. continuing\n", __func__, (nRewind - 1), e.what());
            }
        }
    } catch (const std::runtime_error& e) {
        GetNotifications().fatalError(strprintf(_("System error while loading external block file: %s"), e.what()));
    }
    LogPrintf("Loaded %i blocks from external file in %dms\n", nLoaded, Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}